

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O2

pair<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
* jessilib::
  word_split_once<std::basic_string_view<char16_t,std::char_traits<char16_t>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
            (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             begin,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                   end,char16_t in_whitespace)

{
  pair<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
  *in_RDI;
  long lVar1;
  long lVar2;
  long lVar3;
  char16_t *pcVar4;
  
  if (end._M_current <= begin._M_current) {
    (in_RDI->second)._M_len = 0;
    (in_RDI->second)._M_str = (char16_t *)0x0;
    (in_RDI->first)._M_len = 0;
    (in_RDI->first)._M_str = (char16_t *)0x0;
    return in_RDI;
  }
  lVar1 = (long)end._M_current - (long)begin._M_current;
  for (; (begin._M_current != end._M_current && (*begin._M_current == in_whitespace));
      begin._M_current = begin._M_current + 1) {
    lVar1 = lVar1 + -2;
  }
  lVar3 = 0;
  while( true ) {
    if (begin._M_current + lVar3 == end._M_current) {
      (in_RDI->first)._M_len = lVar1 >> 1;
      (in_RDI->first)._M_str = begin._M_current;
      (in_RDI->second)._M_len = 0;
      (in_RDI->second)._M_str = (char16_t *)0x0;
      return in_RDI;
    }
    if (*(begin._M_current + lVar3) == in_whitespace) break;
    lVar3 = lVar3 + 2;
  }
  pcVar4 = begin._M_current + lVar3;
  lVar1 = (lVar1 + -2) - lVar3;
  do {
    lVar2 = lVar1;
    pcVar4 = pcVar4 + 1;
    if (pcVar4 == end._M_current) break;
    lVar1 = lVar2 + -2;
  } while (*pcVar4 == in_whitespace);
  (in_RDI->first)._M_len = lVar3 >> 1;
  (in_RDI->first)._M_str = begin._M_current;
  (in_RDI->second)._M_len = lVar2 >> 1;
  (in_RDI->second)._M_str = pcVar4;
  return in_RDI;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}